

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  TokenType TVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  char *__end;
  bool bVar7;
  string_view message;
  string_view message_00;
  string_view message_01;
  string text;
  undefined1 local_e0 [48];
  undefined1 local_b0 [32];
  char *local_90;
  char *local_88;
  long local_80 [4];
  AlphaNum local_60;
  
  iVar5 = this->recursion_limit_;
  this->recursion_limit_ = iVar5 + -1;
  if (iVar5 < 1) {
    local_e0._0_8_ = (pointer)0x4b;
    local_e0._8_8_ = "Message is too deep, the parser exceeded the configured recursion limit of ";
    pcVar2 = local_60.digits_;
    lVar6 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                      (this->initial_recursion_limit_,pcVar2);
    local_60.piece_._M_len = lVar6 - (long)pcVar2;
    local_90 = (char *)0x1;
    local_88 = ".";
    local_60.piece_._M_str = pcVar2;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b0,(AlphaNum *)local_e0,&local_60);
    message._M_str = (char *)local_b0._0_8_;
    message._M_len = local_b0._8_8_;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
      return false;
    }
    goto LAB_00308f7a;
  }
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_STRING) {
    while ((this_00->current_).type == TYPE_STRING) {
      io::Tokenizer::Next(this_00);
    }
  }
  else {
    pcVar3 = local_e0 + 0x10;
    local_e0._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"[","");
    bVar4 = TryConsume(this,(string *)local_e0);
    if ((pointer)local_e0._0_8_ != pcVar3) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    if (bVar4) {
      local_e0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"]","");
      bVar4 = TryConsume(this,(string *)local_e0);
      if ((pointer)local_e0._0_8_ != pcVar3) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
      if (!bVar4) {
        do {
          local_e0._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"{","");
          pcVar2 = (char *)(this->tokenizer_).current_.text._M_string_length;
          if (pcVar2 == (char *)local_e0._8_8_) {
            if (pcVar2 == (char *)0x0) {
              bVar4 = true;
            }
            else {
              iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_e0._0_8_,
                           (size_t)pcVar2);
              bVar4 = iVar5 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          if (bVar4) {
LAB_00308d81:
            bVar7 = false;
          }
          else {
            local_60.piece_._M_len = (size_t)local_60.digits_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"<","");
            pcVar2 = (char *)(this->tokenizer_).current_.text._M_string_length;
            bVar7 = true;
            if (pcVar2 == local_60.piece_._M_str) {
              if (pcVar2 == (char *)0x0) goto LAB_00308d81;
              iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                           (void *)local_60.piece_._M_len,(size_t)pcVar2);
              bVar7 = iVar5 != 0;
            }
          }
          if ((!bVar4) && ((char *)local_60.piece_._M_len != local_60.digits_)) {
            operator_delete((void *)local_60.piece_._M_len,local_60.digits_._0_8_ + 1);
          }
          if ((pointer)local_e0._0_8_ != pcVar3) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          if (bVar7) {
            bVar4 = SkipFieldValue(this);
          }
          else {
            bVar4 = SkipFieldMessage(this);
          }
          if (bVar4 == false) {
            return false;
          }
          local_e0._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"]","");
          bVar4 = TryConsume(this,(string *)local_e0);
          if ((pointer)local_e0._0_8_ != pcVar3) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          if (bVar4) break;
          local_e0._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,",","");
          bVar4 = Consume(this,(string *)local_e0);
          if ((pointer)local_e0._0_8_ != pcVar3) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          if (!bVar4) {
            return false;
          }
        } while( true );
      }
    }
    else {
      local_e0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"-","");
      bVar4 = TryConsume(this,(string *)local_e0);
      if ((pointer)local_e0._0_8_ != pcVar3) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
      }
      TVar1 = (this_00->current_).type;
      if (2 < TVar1 - TYPE_IDENTIFIER) {
        pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_90 = (char *)local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,
                   pcVar3 + (this->tokenizer_).current_.text._M_string_length);
        local_e0._0_8_ = (pointer)0x2b;
        local_e0._8_8_ = "Cannot skip field value, unexpected token: ";
        local_60.piece_._M_len = (size_t)local_88;
        local_60.piece_._M_str = local_90;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b0,(AlphaNum *)local_e0);
        message_01._M_str = (char *)local_b0._0_8_;
        message_01._M_len = local_b0._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_01);
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        this->recursion_limit_ = this->recursion_limit_ + 1;
        local_b0._16_8_ = local_80[0];
        local_b0._0_8_ = local_90;
        if ((long *)local_90 == local_80) {
          return false;
        }
LAB_00308f7a:
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        return false;
      }
      if (bVar4 && TVar1 == TYPE_IDENTIFIER) {
        pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_90 = (char *)local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,
                   pcVar3 + (this->tokenizer_).current_.text._M_string_length);
        absl::lts_20240722::AsciiStrToLower((string *)&local_90);
        iVar5 = std::__cxx11::string::compare((char *)&local_90);
        if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_90), iVar5 != 0))
           && (iVar5 = std::__cxx11::string::compare((char *)&local_90), iVar5 != 0)) {
          local_e0._0_8_ = (pointer)0x16;
          local_e0._8_8_ = "Invalid float number: ";
          local_60.piece_._M_len = (size_t)local_88;
          local_60.piece_._M_str = local_90;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b0,(AlphaNum *)local_e0);
          message_00._M_str = (char *)local_b0._0_8_;
          message_00._M_len = local_b0._8_8_;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_00);
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
          }
          this->recursion_limit_ = this->recursion_limit_ + 1;
          local_b0._16_8_ = local_80[0];
          local_b0._0_8_ = local_90;
          if ((long *)local_90 == local_80) {
            return false;
          }
          goto LAB_00308f7a;
        }
        if ((long *)local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      io::Tokenizer::Next(this_00);
    }
  }
  this->recursion_limit_ = this->recursion_limit_ + 1;
  return true;
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      if (!TryConsume("]")) {
        while (true) {
          if (!LookingAt("{") && !LookingAt("<")) {
            DO(SkipFieldValue());
          } else {
            DO(SkipFieldMessage());
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError(
          absl::StrCat("Cannot skip field value, unexpected token: ", text));
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError(absl::StrCat("Invalid float number: ", text));
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }